

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [12];
  byte bVar49;
  byte bVar50;
  int iVar51;
  AABBNodeMB4D *node1;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  byte bVar55;
  QuadMesh *mesh;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar56;
  long lVar57;
  ulong uVar58;
  uint uVar59;
  ulong uVar60;
  byte bVar61;
  float *vertices1;
  vuint<4> *v;
  long lVar62;
  NodeRef *pNVar63;
  NodeRef root;
  undefined4 uVar64;
  ulong uVar65;
  bool bVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  vfloat_impl<4> vVar92;
  vfloat_impl<4> vVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar107;
  float fVar108;
  vint4 ai_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar110;
  vint4 ai;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 in_ZMM2 [64];
  float fVar116;
  float fVar120;
  float fVar121;
  vint4 ai_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  undefined1 auVar119 [16];
  float fVar123;
  float fVar127;
  float fVar128;
  vint4 ai_3;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  undefined1 auVar126 [16];
  float fVar130;
  float fVar137;
  float fVar138;
  vint4 bi;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  float fVar144;
  float fVar145;
  vint4 bi_1;
  undefined1 auVar141 [16];
  float fVar146;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  float fVar153;
  float fVar154;
  vint4 bi_3;
  undefined1 auVar148 [16];
  float fVar155;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  uint uVar166;
  uint uVar171;
  undefined1 auVar167 [16];
  uint uVar169;
  uint uVar170;
  undefined1 auVar168 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  vuint<4> *v_1;
  uint local_37d4;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  Vec3<embree::vfloat_impl<4>_> p0;
  int local_3618;
  int iStack_3614;
  int iStack_3610;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar69 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar74 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar74,5);
    uVar68 = vpcmpeqd_avx512vl(auVar69,(undefined1  [16])valid_i->field_0);
    uVar68 = ((byte)uVar10 & 0xf) & uVar68;
    bVar50 = (byte)uVar68;
    if (bVar50 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar174 = ZEXT1664(auVar69);
      auVar70 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar69);
      auVar72._8_4_ = 0x219392ef;
      auVar72._0_8_ = 0x219392ef219392ef;
      auVar72._12_4_ = 0x219392ef;
      uVar52 = vcmpps_avx512vl(auVar70,auVar72,1);
      bVar66 = (bool)((byte)uVar52 & 1);
      auVar70._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._0_4_;
      bVar66 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._4_4_;
      bVar66 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._8_4_;
      bVar66 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._12_4_;
      auVar71 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar69);
      uVar52 = vcmpps_avx512vl(auVar71,auVar72,1);
      bVar66 = (bool)((byte)uVar52 & 1);
      auVar71._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._16_4_;
      bVar66 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar71._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._20_4_;
      bVar66 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar71._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._24_4_;
      bVar66 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar71._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._28_4_;
      auVar69 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar69);
      uVar52 = vcmpps_avx512vl(auVar69,auVar72,1);
      bVar66 = (bool)((byte)uVar52 & 1);
      auVar69._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._32_4_;
      bVar66 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._36_4_;
      bVar66 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._40_4_;
      bVar66 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * tray.dir.field_0._44_4_;
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar175 = ZEXT1664(auVar72);
      auVar73 = vrcp14ps_avx512vl(auVar70);
      auVar70 = vfnmadd213ps_avx512vl(auVar70,auVar73,auVar72);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar70,auVar73,auVar73)
      ;
      auVar70 = vrcp14ps_avx512vl(auVar71);
      auVar71 = vfnmadd213ps_avx512vl(auVar71,auVar70,auVar72);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar71,auVar70,auVar70)
      ;
      auVar70 = vrcp14ps_avx512vl(auVar69);
      auVar69 = vfnmadd213ps_avx512vl(auVar69,auVar70,auVar72);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar69,auVar70,auVar70)
      ;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar52 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar74,1);
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar52 & 1) * auVar69._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar52 >> 1) & 1) * auVar69._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar52 >> 2) & 1) * auVar69._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar52 >> 3) & 1) * auVar69._12_4_;
      uVar52 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar74,5);
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar66 = (bool)((byte)uVar52 & 1);
      bVar7 = (bool)((byte)(uVar52 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar52 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar52 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar66 * auVar69._0_4_ | (uint)!bVar66 * 0x60;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar69._4_4_ | (uint)!bVar7 * 0x60;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * 0x60;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar69._12_4_ | (uint)!bVar9 * 0x60;
      uVar52 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar74,5);
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar66 = (bool)((byte)uVar52 & 1);
      bVar7 = (bool)((byte)(uVar52 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar52 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar52 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar66 * auVar69._0_4_ | (uint)!bVar66 * 0xa0;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar69._4_4_ | (uint)!bVar7 * 0xa0;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * 0xa0;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar69._12_4_ | (uint)!bVar9 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar177 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar69 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar74);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar50 & 1) * auVar69._0_4_ |
           (uint)!(bool)(bVar50 & 1) * stack_near[0].field_0._0_4_;
      bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar66 * auVar69._4_4_ | (uint)!bVar66 * stack_near[0].field_0._4_4_;
      bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar66 * auVar69._8_4_ | (uint)!bVar66 * stack_near[0].field_0._8_4_;
      bVar66 = SUB81(uVar68 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar66 * auVar69._12_4_ | (uint)!bVar66 * stack_near[0].field_0._12_4_;
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar176 = ZEXT1664(auVar69);
      auVar74 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar74);
      tray.tfar.field_0.i[0] =
           (uint)(bVar50 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar69._0_4_;
      bVar66 = (bool)((byte)(uVar68 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar66 * auVar74._4_4_ | (uint)!bVar66 * auVar69._4_4_;
      bVar66 = (bool)((byte)(uVar68 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar66 * auVar74._8_4_ | (uint)!bVar66 * auVar69._8_4_;
      bVar66 = SUB81(uVar68 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar66 * auVar74._12_4_ | (uint)!bVar66 * auVar69._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar59 = 3;
      }
      else {
        uVar59 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_37d4 = (ushort)uVar68 ^ 0xf;
      pNVar63 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar56 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar69 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar178 = ZEXT1664(auVar69);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar179 = ZEXT1664(auVar69);
      do {
        paVar56 = paVar56 + -1;
        root.ptr = pNVar63[-1].ptr;
        pNVar63 = pNVar63 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0081f2af:
          iVar51 = 3;
        }
        else {
          aVar2 = *paVar56;
          uVar68 = vcmpps_avx512vl((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar68 == '\0') {
LAB_0081f2e4:
            iVar51 = 2;
          }
          else {
            uVar64 = (undefined4)uVar68;
            iVar51 = 0;
            if ((uint)POPCOUNT(uVar64) <= uVar59) {
              do {
                sVar3 = 0;
                for (uVar52 = uVar68; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000)
                {
                  sVar3 = sVar3 + 1;
                }
                bVar66 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
                bVar49 = (byte)(1 << ((uint)sVar3 & 0x1f));
                if (!bVar66) {
                  bVar49 = 0;
                }
                bVar49 = (byte)local_37d4 | bVar49;
                local_37d4 = (uint)bVar49;
                uVar68 = uVar68 - 1 & uVar68;
              } while (uVar68 != 0);
              if (bVar49 == 0xf) {
                iVar51 = 3;
              }
              else {
                auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar49 & 1) * auVar69._0_4_ |
                     (uint)!(bool)(bVar49 & 1) * tray.tfar.field_0.i[0];
                bVar66 = (bool)(bVar49 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar66 * auVar69._4_4_ | (uint)!bVar66 * tray.tfar.field_0.i[1];
                bVar66 = (bool)(bVar49 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar66 * auVar69._8_4_ | (uint)!bVar66 * tray.tfar.field_0.i[2];
                bVar66 = (bool)(bVar49 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar66 * auVar69._12_4_ | (uint)!bVar66 * tray.tfar.field_0.i[3];
                iVar51 = 2;
              }
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar174 = ZEXT1664(auVar69);
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar175 = ZEXT1664(auVar69);
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar176 = ZEXT1664(auVar69);
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar177 = ZEXT1664(auVar69);
              auVar69 = vxorps_avx512vl(auVar178._0_16_,auVar178._0_16_);
              auVar178 = ZEXT1664(auVar69);
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar179 = ZEXT1664(auVar69);
            }
            auVar168 = ZEXT1664((undefined1  [16])aVar2);
            if (uVar59 < (uint)POPCOUNT(uVar64)) {
              do {
                uVar166 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0081f2af;
                  uVar10 = vcmpps_avx512vl(auVar168._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar10 != '\0') {
                    uVar68 = (ulong)(uVar166 & 0xf);
                    bVar49 = (byte)((ulong)local_37d4 & 0xffffffffffffff0f);
                    if (uVar68 != 8) {
                      uVar52 = (ulong)local_37d4 & 0xffffffffffffff0f ^ 0xf;
                      uVar54 = 0;
                      do {
                        lVar62 = uVar54 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        bVar49 = (byte)uVar52;
                        uVar13 = 0;
                        for (uVar53 = uVar52; (uVar53 & 1) == 0;
                            uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                          uVar13 = uVar13 + 1;
                        }
                        uVar53 = uVar52;
                        uVar65 = 0;
                        while( true ) {
                          bVar61 = (byte)uVar53;
                          auVar69 = auVar178._0_16_;
                          if (*(int *)(lVar62 + 0x50 + uVar65 * 4) == -1) break;
                          pGVar4 = (context->scene->geometries).items
                                   [*(uint *)(lVar62 + 0x40 + uVar65 * 4)].ptr;
                          fVar100 = (pGVar4->time_range).lower;
                          auVar74._4_4_ = fVar100;
                          auVar74._0_4_ = fVar100;
                          auVar74._8_4_ = fVar100;
                          auVar74._12_4_ = fVar100;
                          fVar101 = pGVar4->fnumTimeSegments;
                          auVar76._4_4_ = fVar101;
                          auVar76._0_4_ = fVar101;
                          auVar76._8_4_ = fVar101;
                          auVar76._12_4_ = fVar101;
                          auVar74 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar74);
                          fVar100 = (pGVar4->time_range).upper - fVar100;
                          auVar73._4_4_ = fVar100;
                          auVar73._0_4_ = fVar100;
                          auVar73._8_4_ = fVar100;
                          auVar73._12_4_ = fVar100;
                          auVar74 = vdivps_avx(auVar74,auVar73);
                          auVar75._0_4_ = fVar101 * auVar74._0_4_;
                          auVar75._4_4_ = fVar101 * auVar74._4_4_;
                          auVar75._8_4_ = fVar101 * auVar74._8_4_;
                          auVar75._12_4_ = fVar101 * auVar74._12_4_;
                          auVar74 = vroundps_avx(auVar75,1);
                          auVar70 = vaddss_avx512f(auVar76,SUB6416(ZEXT464(0xbf800000),0));
                          auVar77._0_4_ = auVar70._0_4_;
                          auVar77._4_4_ = auVar77._0_4_;
                          auVar77._8_4_ = auVar77._0_4_;
                          auVar77._12_4_ = auVar77._0_4_;
                          auVar74 = vminps_avx(auVar74,auVar77);
                          auVar74 = vmaxps_avx512vl(auVar74,auVar69);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar74);
                          auVar74 = vsubps_avx(auVar75,auVar74);
                          auVar70 = vpbroadcastd_avx512vl();
                          uVar10 = vpcmpeqd_avx512vl(auVar70,(undefined1  [16])itime.field_0);
                          if (((byte)uVar10 & 0xf | ~bVar49 & 0xf) == 0xf) {
                            lVar57 = (long)itime.field_0.i[uVar13] * 0x38;
                            lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar57);
                            lVar57 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar57);
                            uVar67 = (ulong)*(uint *)(lVar62 + uVar65 * 4);
                            uVar60 = (ulong)*(uint *)(lVar62 + 0x10 + uVar65 * 4);
                            auVar77 = vsubps_avx512vl(auVar175._0_16_,auVar74);
                            uVar64 = *(undefined4 *)(lVar57 + uVar67 * 4);
                            auVar90._4_4_ = uVar64;
                            auVar90._0_4_ = uVar64;
                            auVar90._8_4_ = uVar64;
                            auVar90._12_4_ = uVar64;
                            auVar70 = vmulps_avx512vl(auVar74,auVar90);
                            uVar64 = *(undefined4 *)(lVar57 + 4 + uVar67 * 4);
                            auVar91._4_4_ = uVar64;
                            auVar91._0_4_ = uVar64;
                            auVar91._8_4_ = uVar64;
                            auVar91._12_4_ = uVar64;
                            auVar71 = vmulps_avx512vl(auVar74,auVar91);
                            uVar64 = *(undefined4 *)(lVar57 + 8 + uVar67 * 4);
                            auVar24._4_4_ = uVar64;
                            auVar24._0_4_ = uVar64;
                            auVar24._8_4_ = uVar64;
                            auVar24._12_4_ = uVar64;
                            auVar72 = vmulps_avx512vl(auVar74,auVar24);
                            uVar64 = *(undefined4 *)(lVar5 + uVar67 * 4);
                            auVar25._4_4_ = uVar64;
                            auVar25._0_4_ = uVar64;
                            auVar25._8_4_ = uVar64;
                            auVar25._12_4_ = uVar64;
                            auVar78 = vfmadd231ps_avx512vl(auVar70,auVar77,auVar25);
                            uVar64 = *(undefined4 *)(lVar5 + 4 + uVar67 * 4);
                            auVar26._4_4_ = uVar64;
                            auVar26._0_4_ = uVar64;
                            auVar26._8_4_ = uVar64;
                            auVar26._12_4_ = uVar64;
                            auVar79 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar26);
                            uVar64 = *(undefined4 *)(lVar5 + 8 + uVar67 * 4);
                            auVar27._4_4_ = uVar64;
                            auVar27._0_4_ = uVar64;
                            auVar27._8_4_ = uVar64;
                            auVar27._12_4_ = uVar64;
                            auVar80 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar27);
                            uVar64 = *(undefined4 *)(lVar57 + uVar60 * 4);
                            auVar28._4_4_ = uVar64;
                            auVar28._0_4_ = uVar64;
                            auVar28._8_4_ = uVar64;
                            auVar28._12_4_ = uVar64;
                            auVar70 = vmulps_avx512vl(auVar74,auVar28);
                            uVar64 = *(undefined4 *)(lVar57 + 4 + uVar60 * 4);
                            auVar29._4_4_ = uVar64;
                            auVar29._0_4_ = uVar64;
                            auVar29._8_4_ = uVar64;
                            auVar29._12_4_ = uVar64;
                            auVar71 = vmulps_avx512vl(auVar74,auVar29);
                            uVar64 = *(undefined4 *)(lVar57 + 8 + uVar60 * 4);
                            auVar30._4_4_ = uVar64;
                            auVar30._0_4_ = uVar64;
                            auVar30._8_4_ = uVar64;
                            auVar30._12_4_ = uVar64;
                            auVar72 = vmulps_avx512vl(auVar74,auVar30);
                            uVar64 = *(undefined4 *)(lVar5 + uVar60 * 4);
                            auVar31._4_4_ = uVar64;
                            auVar31._0_4_ = uVar64;
                            auVar31._8_4_ = uVar64;
                            auVar31._12_4_ = uVar64;
                            auVar73 = vfmadd231ps_avx512vl(auVar70,auVar77,auVar31);
                            uVar64 = *(undefined4 *)(lVar5 + 4 + uVar60 * 4);
                            auVar32._4_4_ = uVar64;
                            auVar32._0_4_ = uVar64;
                            auVar32._8_4_ = uVar64;
                            auVar32._12_4_ = uVar64;
                            auVar75 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar32);
                            uVar64 = *(undefined4 *)(lVar5 + 8 + uVar60 * 4);
                            auVar33._4_4_ = uVar64;
                            auVar33._0_4_ = uVar64;
                            auVar33._8_4_ = uVar64;
                            auVar33._12_4_ = uVar64;
                            auVar76 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar33);
                            uVar67 = (ulong)*(uint *)(lVar62 + 0x20 + uVar65 * 4);
                            uVar64 = *(undefined4 *)(lVar57 + uVar67 * 4);
                            auVar34._4_4_ = uVar64;
                            auVar34._0_4_ = uVar64;
                            auVar34._8_4_ = uVar64;
                            auVar34._12_4_ = uVar64;
                            auVar70 = vmulps_avx512vl(auVar74,auVar34);
                            uVar64 = *(undefined4 *)(lVar57 + 4 + uVar67 * 4);
                            auVar35._4_4_ = uVar64;
                            auVar35._0_4_ = uVar64;
                            auVar35._8_4_ = uVar64;
                            auVar35._12_4_ = uVar64;
                            auVar72 = vmulps_avx512vl(auVar74,auVar35);
                            uVar64 = *(undefined4 *)(lVar57 + 8 + uVar67 * 4);
                            auVar36._4_4_ = uVar64;
                            auVar36._0_4_ = uVar64;
                            auVar36._8_4_ = uVar64;
                            auVar36._12_4_ = uVar64;
                            auVar81 = vmulps_avx512vl(auVar74,auVar36);
                            uVar64 = *(undefined4 *)(lVar5 + uVar67 * 4);
                            auVar37._4_4_ = uVar64;
                            auVar37._0_4_ = uVar64;
                            auVar37._8_4_ = uVar64;
                            auVar37._12_4_ = uVar64;
                            auVar71 = vfmadd231ps_avx512vl(auVar70,auVar77,auVar37);
                            uVar64 = *(undefined4 *)(lVar5 + 4 + uVar67 * 4);
                            auVar38._4_4_ = uVar64;
                            auVar38._0_4_ = uVar64;
                            auVar38._8_4_ = uVar64;
                            auVar38._12_4_ = uVar64;
                            auVar72 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar38);
                            uVar64 = *(undefined4 *)(lVar5 + 8 + uVar67 * 4);
                            auVar39._4_4_ = uVar64;
                            auVar39._0_4_ = uVar64;
                            auVar39._8_4_ = uVar64;
                            auVar39._12_4_ = uVar64;
                            auVar70 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar39);
                            uVar67 = (ulong)*(uint *)(lVar62 + 0x30 + uVar65 * 4);
                            uVar64 = *(undefined4 *)(lVar57 + uVar67 * 4);
                            auVar40._4_4_ = uVar64;
                            auVar40._0_4_ = uVar64;
                            auVar40._8_4_ = uVar64;
                            auVar40._12_4_ = uVar64;
                            auVar81 = vmulps_avx512vl(auVar74,auVar40);
                            uVar64 = *(undefined4 *)(lVar57 + 4 + uVar67 * 4);
                            auVar41._4_4_ = uVar64;
                            auVar41._0_4_ = uVar64;
                            auVar41._8_4_ = uVar64;
                            auVar41._12_4_ = uVar64;
                            auVar82 = vmulps_avx512vl(auVar74,auVar41);
                            uVar64 = *(undefined4 *)(lVar57 + 8 + uVar67 * 4);
                            auVar42._4_4_ = uVar64;
                            auVar42._0_4_ = uVar64;
                            auVar42._8_4_ = uVar64;
                            auVar42._12_4_ = uVar64;
                            auVar83 = vmulps_avx512vl(auVar74,auVar42);
                            uVar64 = *(undefined4 *)(lVar5 + uVar67 * 4);
                            auVar43._4_4_ = uVar64;
                            auVar43._0_4_ = uVar64;
                            auVar43._8_4_ = uVar64;
                            auVar43._12_4_ = uVar64;
                            auVar74 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar43);
                            uVar64 = *(undefined4 *)(lVar5 + 4 + uVar67 * 4);
                            auVar44._4_4_ = uVar64;
                            auVar44._0_4_ = uVar64;
                            auVar44._8_4_ = uVar64;
                            auVar44._12_4_ = uVar64;
                            auVar84 = vfmadd231ps_avx512vl(auVar82,auVar77,auVar44);
                            uVar64 = *(undefined4 *)(lVar5 + 8 + uVar67 * 4);
                            auVar45._4_4_ = uVar64;
                            auVar45._0_4_ = uVar64;
                            auVar45._8_4_ = uVar64;
                            auVar45._12_4_ = uVar64;
                            auVar85 = vfmadd231ps_avx512vl(auVar83,auVar77,auVar45);
                          }
                          else {
                            uVar10 = p1.field_0._0_8_;
                            uVar11 = p1.field_0._32_8_;
                            uVar12 = p1.field_0._24_8_;
                            if (bVar49 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar58 = (ulong)*(uint *)(lVar62 + uVar65 * 4);
                              uVar60 = uVar52;
                              uVar67 = uVar13;
                              do {
                                lVar57 = (long)itime.field_0.i[uVar67] * 0x38;
                                auVar70 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar57) + uVar58 * 4);
                                auVar71 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar57) + uVar58 * 4);
                                *(int *)((long)&p0.field_0 + uVar67 * 4) = auVar70._0_4_;
                                uVar64 = vextractps_avx(auVar70,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx(auVar70,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                *(int *)((long)&p1.field_0 + uVar67 * 4) = auVar71._0_4_;
                                uVar64 = vextractps_avx(auVar71,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx(auVar71,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                uVar60 = uVar60 ^ 1L << (uVar67 & 0x3f);
                                uVar67 = 0;
                                for (uVar14 = uVar60; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar67 = uVar67 + 1;
                                }
                                uVar10 = p1.field_0._0_8_;
                                uVar11 = p1.field_0._32_8_;
                                uVar12 = p1.field_0._24_8_;
                              } while (uVar60 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar12;
                            p1.field_0._36_4_ = (undefined4)((ulong)uVar11 >> 0x20);
                            p1.field_0._32_4_ = (undefined4)uVar11;
                            p1.field_0._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                            p1.field_0._0_4_ = (undefined4)uVar10;
                            auVar70 = vsubps_avx512vl(auVar175._0_16_,auVar74);
                            fVar104 = auVar70._0_4_;
                            fVar110 = fVar104 * (float)p0.field_0._0_4_;
                            fVar107 = auVar70._4_4_;
                            fVar113 = fVar107 * (float)p0.field_0._4_4_;
                            fVar108 = auVar70._8_4_;
                            fVar114 = fVar108 * (float)p0.field_0._8_4_;
                            fVar109 = auVar70._12_4_;
                            fVar115 = fVar109 * (float)p0.field_0._12_4_;
                            fVar116 = fVar104 * (float)p0.field_0._16_4_;
                            fVar120 = fVar107 * (float)p0.field_0._20_4_;
                            fVar121 = fVar108 * (float)p0.field_0._24_4_;
                            fVar122 = fVar109 * (float)p0.field_0._28_4_;
                            fVar123 = fVar104 * (float)p0.field_0._32_4_;
                            fVar127 = fVar107 * (float)p0.field_0._36_4_;
                            fVar128 = fVar108 * (float)p0.field_0._40_4_;
                            fVar129 = fVar109 * (float)p0.field_0._44_4_;
                            fVar100 = auVar74._0_4_;
                            fVar130 = fVar100 * (float)p1.field_0._0_4_;
                            fVar101 = auVar74._4_4_;
                            fVar137 = fVar101 * (float)p1.field_0._4_4_;
                            fVar102 = auVar74._8_4_;
                            fVar138 = fVar102 * (float)p1.field_0._8_4_;
                            fVar103 = auVar74._12_4_;
                            fVar139 = fVar103 * (float)p1.field_0._12_4_;
                            fVar140 = fVar100 * (float)p1.field_0._16_4_;
                            fVar144 = fVar101 * (float)p1.field_0._20_4_;
                            fVar145 = fVar102 * (float)p1.field_0._24_4_;
                            fVar146 = fVar103 * (float)p1.field_0._28_4_;
                            fVar147 = fVar100 * (float)p1.field_0._32_4_;
                            fVar153 = fVar101 * (float)p1.field_0._36_4_;
                            fVar154 = fVar102 * (float)p1.field_0._40_4_;
                            fVar155 = fVar103 * (float)p1.field_0._44_4_;
                            if (bVar49 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar58 = (ulong)*(uint *)(lVar62 + 0x10 + uVar65 * 4);
                              uVar60 = uVar52;
                              uVar67 = uVar13;
                              p1.field_0._0_8_ = uVar10;
                              p1.field_0._32_8_ = uVar11;
                              p1.field_0._24_8_ = uVar12;
                              do {
                                lVar57 = (long)itime.field_0.i[uVar67] * 0x38;
                                auVar71 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar57) + uVar58 * 4);
                                auVar72 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar57) + uVar58 * 4);
                                *(int *)((long)&p0.field_0 + uVar67 * 4) = auVar71._0_4_;
                                uVar64 = vextractps_avx(auVar71,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx(auVar71,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                *(int *)((long)&p1.field_0 + uVar67 * 4) = auVar72._0_4_;
                                uVar64 = vextractps_avx(auVar72,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx(auVar72,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                uVar60 = uVar60 ^ 1L << (uVar67 & 0x3f);
                                uVar67 = 0;
                                for (uVar14 = uVar60; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar67 = uVar67 + 1;
                                }
                                uVar10 = p1.field_0._0_8_;
                                uVar11 = p1.field_0._32_8_;
                                uVar12 = p1.field_0._24_8_;
                              } while (uVar60 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar12;
                            p1.field_0._36_4_ = (undefined4)((ulong)uVar11 >> 0x20);
                            p1.field_0._32_4_ = (undefined4)uVar11;
                            p1.field_0._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                            p1.field_0._0_4_ = (undefined4)uVar10;
                            auVar81._0_4_ = fVar104 * (float)p0.field_0._0_4_;
                            auVar81._4_4_ = fVar107 * (float)p0.field_0._4_4_;
                            auVar81._8_4_ = fVar108 * (float)p0.field_0._8_4_;
                            auVar81._12_4_ = fVar109 * (float)p0.field_0._12_4_;
                            auVar82._0_4_ = fVar104 * (float)p0.field_0._16_4_;
                            auVar82._4_4_ = fVar107 * (float)p0.field_0._20_4_;
                            auVar82._8_4_ = fVar108 * (float)p0.field_0._24_4_;
                            auVar82._12_4_ = fVar109 * (float)p0.field_0._28_4_;
                            auVar83._0_4_ = fVar104 * (float)p0.field_0._32_4_;
                            auVar83._4_4_ = fVar107 * (float)p0.field_0._36_4_;
                            auVar83._8_4_ = fVar108 * (float)p0.field_0._40_4_;
                            auVar83._12_4_ = fVar109 * (float)p0.field_0._44_4_;
                            auVar94._0_4_ = fVar100 * (float)p1.field_0._0_4_;
                            auVar94._4_4_ = fVar101 * (float)p1.field_0._4_4_;
                            auVar94._8_4_ = fVar102 * (float)p1.field_0._8_4_;
                            auVar94._12_4_ = fVar103 * (float)p1.field_0._12_4_;
                            auVar95._0_4_ = fVar100 * (float)p1.field_0._16_4_;
                            auVar95._4_4_ = fVar101 * (float)p1.field_0._20_4_;
                            auVar95._8_4_ = fVar102 * (float)p1.field_0._24_4_;
                            auVar95._12_4_ = fVar103 * (float)p1.field_0._28_4_;
                            auVar96._0_4_ = fVar100 * (float)p1.field_0._32_4_;
                            auVar96._4_4_ = fVar101 * (float)p1.field_0._36_4_;
                            auVar96._8_4_ = fVar102 * (float)p1.field_0._40_4_;
                            auVar96._12_4_ = fVar103 * (float)p1.field_0._44_4_;
                            p1.field_0._0_8_ = uVar10;
                            p1.field_0._32_8_ = uVar11;
                            if (bVar49 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar58 = (ulong)*(uint *)(lVar62 + 0x20 + uVar65 * 4);
                              uVar60 = uVar52;
                              uVar67 = uVar13;
                              p1.field_0._24_8_ = uVar12;
                              do {
                                lVar57 = (long)itime.field_0.i[uVar67] * 0x38;
                                auVar71 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar57) + uVar58 * 4);
                                auVar72 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar57) + uVar58 * 4);
                                *(int *)((long)&p0.field_0 + uVar67 * 4) = auVar71._0_4_;
                                uVar64 = vextractps_avx(auVar71,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx(auVar71,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                *(int *)((long)&p1.field_0 + uVar67 * 4) = auVar72._0_4_;
                                uVar64 = vextractps_avx(auVar72,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx(auVar72,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                uVar60 = uVar60 ^ 1L << (uVar67 & 0x3f);
                                uVar67 = 0;
                                for (uVar14 = uVar60; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar67 = uVar67 + 1;
                                }
                                uVar12 = p1.field_0._24_8_;
                              } while (uVar60 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar12;
                            auVar87._0_4_ = fVar104 * (float)p0.field_0._0_4_;
                            auVar87._4_4_ = fVar107 * (float)p0.field_0._4_4_;
                            auVar87._8_4_ = fVar108 * (float)p0.field_0._8_4_;
                            auVar87._12_4_ = fVar109 * (float)p0.field_0._12_4_;
                            auVar70 = vmulps_avx512vl(auVar70,(undefined1  [16])
                                                              p0.field_0.field_0.y.field_0);
                            auVar86._0_4_ = fVar104 * (float)p0.field_0._32_4_;
                            auVar86._4_4_ = fVar107 * (float)p0.field_0._36_4_;
                            auVar86._8_4_ = fVar108 * (float)p0.field_0._40_4_;
                            auVar86._12_4_ = fVar109 * (float)p0.field_0._44_4_;
                            auVar97._8_4_ = p1.field_0._8_4_;
                            auVar97._0_8_ = p1.field_0._0_8_;
                            auVar97._12_4_ = p1.field_0._12_4_;
                            auVar71 = vmulps_avx512vl(auVar74,auVar97);
                            auVar98._4_4_ = p1.field_0._20_4_;
                            auVar98._0_4_ = p1.field_0._16_4_;
                            auVar98._8_4_ = p1.field_0._24_4_;
                            auVar98._12_4_ = p1.field_0._28_4_;
                            auVar72 = vmulps_avx512vl(auVar74,auVar98);
                            auVar15._8_4_ = p1.field_0._40_4_;
                            auVar15._0_8_ = p1.field_0._32_8_;
                            auVar15._12_4_ = p1.field_0._44_4_;
                            auVar74 = vmulps_avx512vl(auVar74,auVar15);
                            uVar10 = p1.field_0._0_8_;
                            uVar11 = p1.field_0._32_8_;
                            if (bVar49 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar58 = (ulong)*(uint *)(lVar62 + 0x30 + uVar65 * 4);
                              uVar60 = uVar52;
                              uVar67 = uVar13;
                              p1.field_0._24_8_ = uVar12;
                              do {
                                lVar57 = (long)itime.field_0.i[uVar67] * 0x38;
                                auVar73 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar5 + lVar57) +
                                                              uVar58 * 4));
                                auVar75 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar5 + 0x38 + lVar57) +
                                                              uVar58 * 4));
                                *(int *)((long)&p0.field_0 + uVar67 * 4) = auVar73._0_4_;
                                uVar64 = vextractps_avx512f(auVar73,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx512f(auVar73,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                *(int *)((long)&p1.field_0 + uVar67 * 4) = auVar75._0_4_;
                                uVar64 = vextractps_avx512f(auVar75,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x10) = uVar64;
                                uVar64 = vextractps_avx512f(auVar75,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar67 * 4 + 0x20) = uVar64;
                                uVar60 = uVar60 ^ 1L << (uVar67 & 0x3f);
                                uVar67 = 0;
                                for (uVar14 = uVar60; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar67 = uVar67 + 1;
                                }
                                uVar10 = p1.field_0._0_8_;
                                uVar11 = p1.field_0._32_8_;
                                uVar12 = p1.field_0._24_8_;
                              } while (uVar60 != 0);
                            }
                            p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                            p1.field_0._24_4_ = (undefined4)uVar12;
                            p1.field_0._36_4_ = (undefined4)((ulong)uVar11 >> 0x20);
                            p1.field_0._32_4_ = (undefined4)uVar11;
                            p1.field_0._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                            p1.field_0._0_4_ = (undefined4)uVar10;
                            auVar78._0_4_ = fVar110 + fVar130;
                            auVar78._4_4_ = fVar113 + fVar137;
                            auVar78._8_4_ = fVar114 + fVar138;
                            auVar78._12_4_ = fVar115 + fVar139;
                            auVar79._0_4_ = fVar116 + fVar140;
                            auVar79._4_4_ = fVar120 + fVar144;
                            auVar79._8_4_ = fVar121 + fVar145;
                            auVar79._12_4_ = fVar122 + fVar146;
                            auVar80._0_4_ = fVar123 + fVar147;
                            auVar80._4_4_ = fVar127 + fVar153;
                            auVar80._8_4_ = fVar128 + fVar154;
                            auVar80._12_4_ = fVar129 + fVar155;
                            auVar73 = vaddps_avx512vl(auVar81,auVar94);
                            auVar75 = vaddps_avx512vl(auVar82,auVar95);
                            auVar76 = vaddps_avx512vl(auVar83,auVar96);
                            auVar71 = vaddps_avx512vl(auVar87,auVar71);
                            auVar72 = vaddps_avx512vl(auVar70,auVar72);
                            auVar88._0_4_ = fVar104 * (float)p0.field_0._0_4_;
                            auVar88._4_4_ = fVar107 * (float)p0.field_0._4_4_;
                            auVar88._8_4_ = fVar108 * (float)p0.field_0._8_4_;
                            auVar88._12_4_ = fVar109 * (float)p0.field_0._12_4_;
                            auVar70 = vaddps_avx512vl(auVar86,auVar74);
                            auVar89._0_4_ = fVar100 * (float)p1.field_0._0_4_;
                            auVar89._4_4_ = fVar101 * (float)p1.field_0._4_4_;
                            auVar89._8_4_ = fVar102 * (float)p1.field_0._8_4_;
                            auVar89._12_4_ = fVar103 * (float)p1.field_0._12_4_;
                            auVar74 = vaddps_avx512vl(auVar88,auVar89);
                            auVar84._0_4_ =
                                 fVar104 * (float)p0.field_0._16_4_ +
                                 fVar100 * (float)p1.field_0._16_4_;
                            auVar84._4_4_ =
                                 fVar107 * (float)p0.field_0._20_4_ +
                                 fVar101 * (float)p1.field_0._20_4_;
                            auVar84._8_4_ =
                                 fVar108 * (float)p0.field_0._24_4_ +
                                 fVar102 * (float)p1.field_0._24_4_;
                            auVar84._12_4_ =
                                 fVar109 * (float)p0.field_0._28_4_ +
                                 fVar103 * (float)p1.field_0._28_4_;
                            auVar85._0_4_ =
                                 fVar104 * (float)p0.field_0._32_4_ +
                                 fVar100 * (float)p1.field_0._32_4_;
                            auVar85._4_4_ =
                                 fVar107 * (float)p0.field_0._36_4_ +
                                 fVar101 * (float)p1.field_0._36_4_;
                            auVar85._8_4_ =
                                 fVar108 * (float)p0.field_0._40_4_ +
                                 fVar102 * (float)p1.field_0._40_4_;
                            auVar85._12_4_ =
                                 fVar109 * (float)p0.field_0._44_4_ +
                                 fVar103 * (float)p1.field_0._44_4_;
                            p1.field_0._0_8_ = uVar10;
                            p1.field_0._32_8_ = uVar11;
                            p1.field_0._24_8_ = uVar12;
                          }
                          auVar86 = vsubps_avx512vl(auVar78,auVar73);
                          auVar87 = vsubps_avx512vl(auVar79,auVar75);
                          auVar88 = vsubps_avx512vl(auVar80,auVar76);
                          auVar89 = vsubps_avx512vl(auVar74,auVar78);
                          auVar90 = vsubps_avx512vl(auVar84,auVar79);
                          auVar91 = vsubps_avx512vl(auVar85,auVar80);
                          auVar77 = vmulps_avx512vl(auVar87,auVar91);
                          vVar92.field_0 =
                               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                               vfmsub231ps_avx512vl(auVar77,auVar90,auVar88);
                          auVar105._0_4_ = auVar88._0_4_ * auVar89._0_4_;
                          auVar105._4_4_ = auVar88._4_4_ * auVar89._4_4_;
                          auVar105._8_4_ = auVar88._8_4_ * auVar89._8_4_;
                          auVar105._12_4_ = auVar88._12_4_ * auVar89._12_4_;
                          vVar93.field_0 =
                               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                               vfmsub231ps_avx512vl(auVar105,auVar91,auVar86);
                          auVar77 = vmulps_avx512vl(auVar86,auVar90);
                          auVar96 = vfmsub231ps_fma(auVar77,auVar89,auVar87);
                          auVar83 = vsubps_avx(auVar78,*(undefined1 (*) [16])ray);
                          auVar94 = vsubps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x10));
                          auVar95 = vsubps_avx(auVar80,*(undefined1 (*) [16])(ray + 0x20));
                          auVar77 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar81 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar82 = *(undefined1 (*) [16])(ray + 0x60);
                          auVar125._0_4_ = auVar81._0_4_ * auVar95._0_4_;
                          auVar125._4_4_ = auVar81._4_4_ * auVar95._4_4_;
                          auVar125._8_4_ = auVar81._8_4_ * auVar95._8_4_;
                          auVar125._12_4_ = auVar81._12_4_ * auVar95._12_4_;
                          auVar97 = vfmsub231ps_fma(auVar125,auVar94,auVar82);
                          auVar132._0_4_ = auVar82._0_4_ * auVar83._0_4_;
                          auVar132._4_4_ = auVar82._4_4_ * auVar83._4_4_;
                          auVar132._8_4_ = auVar82._8_4_ * auVar83._8_4_;
                          auVar132._12_4_ = auVar82._12_4_ * auVar83._12_4_;
                          auVar98 = vfmsub231ps_fma(auVar132,auVar95,auVar77);
                          auVar172._0_4_ = auVar77._0_4_ * auVar94._0_4_;
                          auVar172._4_4_ = auVar77._4_4_ * auVar94._4_4_;
                          auVar172._8_4_ = auVar77._8_4_ * auVar94._8_4_;
                          auVar172._12_4_ = auVar77._12_4_ * auVar94._12_4_;
                          auVar15 = vfmsub231ps_fma(auVar172,auVar83,auVar81);
                          auVar156._0_4_ = auVar82._0_4_ * auVar96._0_4_;
                          auVar156._4_4_ = auVar82._4_4_ * auVar96._4_4_;
                          auVar156._8_4_ = auVar82._8_4_ * auVar96._8_4_;
                          auVar156._12_4_ = auVar82._12_4_ * auVar96._12_4_;
                          auVar81 = vfmadd231ps_fma(auVar156,(undefined1  [16])vVar93.field_0,
                                                    auVar81);
                          auVar77 = vfmadd231ps_fma(auVar81,(undefined1  [16])vVar92.field_0,auVar77
                                                   );
                          auVar82 = vandps_avx512vl(auVar77,auVar179._0_16_);
                          auVar81 = vmulps_avx512vl(auVar91,auVar15);
                          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,auVar90);
                          auVar81 = vfmadd231ps_fma(auVar81,auVar97,auVar89);
                          uVar166 = auVar82._0_4_;
                          auVar118._0_4_ = (float)(uVar166 ^ auVar81._0_4_);
                          uVar169 = auVar82._4_4_;
                          auVar118._4_4_ = (float)(uVar169 ^ auVar81._4_4_);
                          uVar170 = auVar82._8_4_;
                          auVar118._8_4_ = (float)(uVar170 ^ auVar81._8_4_);
                          uVar171 = auVar82._12_4_;
                          auVar118._12_4_ = (float)(uVar171 ^ auVar81._12_4_);
                          uVar10 = vcmpps_avx512vl(auVar118,auVar69,5);
                          bVar55 = (byte)uVar10 & bVar61;
                          if (bVar55 != 0) {
                            auVar165._0_4_ = auVar88._0_4_ * auVar15._0_4_;
                            auVar165._4_4_ = auVar88._4_4_ * auVar15._4_4_;
                            auVar165._8_4_ = auVar88._8_4_ * auVar15._8_4_;
                            auVar165._12_4_ = auVar88._12_4_ * auVar15._12_4_;
                            auVar81 = vfmadd213ps_fma(auVar87,auVar98,auVar165);
                            auVar81 = vfmadd213ps_fma(auVar86,auVar97,auVar81);
                            auVar133._0_4_ = (float)(uVar166 ^ auVar81._0_4_);
                            auVar133._4_4_ = (float)(uVar169 ^ auVar81._4_4_);
                            auVar133._8_4_ = (float)(uVar170 ^ auVar81._8_4_);
                            auVar133._12_4_ = (float)(uVar171 ^ auVar81._12_4_);
                            uVar10 = vcmpps_avx512vl(auVar133,auVar69,5);
                            bVar55 = bVar55 & (byte)uVar10;
                            if (bVar55 != 0) {
                              auVar82 = vandps_avx512vl(auVar77,auVar174._0_16_);
                              auVar81 = vsubps_avx(auVar82,auVar118);
                              uVar10 = vcmpps_avx512vl(auVar81,auVar133,5);
                              bVar55 = bVar55 & (byte)uVar10;
                              if (bVar55 == 0) {
LAB_0081eba3:
                                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              }
                              else {
                                auVar160._0_4_ = auVar95._0_4_ * auVar96._0_4_;
                                auVar160._4_4_ = auVar95._4_4_ * auVar96._4_4_;
                                auVar160._8_4_ = auVar95._8_4_ * auVar96._8_4_;
                                auVar160._12_4_ = auVar95._12_4_ * auVar96._12_4_;
                                auVar81 = vfmadd213ps_fma(auVar94,(undefined1  [16])vVar93.field_0,
                                                          auVar160);
                                auVar81 = vfmadd213ps_fma(auVar83,(undefined1  [16])vVar92.field_0,
                                                          auVar81);
                                auVar142._0_4_ = uVar166 ^ auVar81._0_4_;
                                auVar142._4_4_ = uVar169 ^ auVar81._4_4_;
                                auVar142._8_4_ = uVar170 ^ auVar81._8_4_;
                                auVar142._12_4_ = uVar171 ^ auVar81._12_4_;
                                auVar149._0_4_ = auVar82._0_4_ * *(float *)(ray + 0x30);
                                auVar149._4_4_ = auVar82._4_4_ * *(float *)(ray + 0x34);
                                auVar149._8_4_ = auVar82._8_4_ * *(float *)(ray + 0x38);
                                auVar149._12_4_ = auVar82._12_4_ * *(float *)(ray + 0x3c);
                                fVar100 = *(float *)(ray + 0x80);
                                fVar101 = *(float *)(ray + 0x84);
                                fVar102 = *(float *)(ray + 0x88);
                                fVar103 = *(float *)(ray + 0x8c);
                                auVar161._0_4_ = fVar100 * auVar82._0_4_;
                                auVar161._4_4_ = fVar101 * auVar82._4_4_;
                                auVar161._8_4_ = fVar102 * auVar82._8_4_;
                                auVar161._12_4_ = fVar103 * auVar82._12_4_;
                                uVar10 = vcmpps_avx512vl(auVar142,auVar161,2);
                                uVar11 = vcmpps_avx512vl(auVar149,auVar142,1);
                                bVar55 = bVar55 & (byte)uVar10 & (byte)uVar11;
                                if (bVar55 == 0) goto LAB_0081eba3;
                                uVar10 = vcmpps_avx512vl(auVar77,ZEXT816(0) << 0x20,4);
                                bVar55 = bVar55 & (byte)uVar10;
                                if (bVar55 == 0) goto LAB_0081eba3;
                                uVar166 = pGVar4->mask;
                                auVar150._4_4_ = uVar166;
                                auVar150._0_4_ = uVar166;
                                auVar150._8_4_ = uVar166;
                                auVar150._12_4_ = uVar166;
                                uVar10 = vptestmd_avx512vl(auVar150,*(undefined1 (*) [16])
                                                                     (ray + 0x90));
                                bVar55 = bVar55 & (byte)uVar10 & 0xf;
                                uVar67 = (ulong)bVar55;
                                if (bVar55 == 0) goto LAB_0081eba3;
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar81 = vrcp14ps_avx512vl(auVar82);
                                  auVar158._8_4_ = 0x3f800000;
                                  auVar158._0_8_ = &DAT_3f8000003f800000;
                                  auVar158._12_4_ = 0x3f800000;
                                  auVar77 = vfnmadd213ps_fma(auVar82,auVar81,auVar158);
                                  auVar77 = vfmadd132ps_fma(auVar77,auVar81,auVar81);
                                  auVar119._0_4_ = auVar77._0_4_ * auVar118._0_4_;
                                  auVar119._4_4_ = auVar77._4_4_ * auVar118._4_4_;
                                  auVar119._8_4_ = auVar77._8_4_ * auVar118._8_4_;
                                  auVar119._12_4_ = auVar77._12_4_ * auVar118._12_4_;
                                  vminps_avx(auVar119,auVar158);
                                  auVar135._0_4_ = auVar77._0_4_ * auVar133._0_4_;
                                  auVar135._4_4_ = auVar77._4_4_ * auVar133._4_4_;
                                  auVar135._8_4_ = auVar77._8_4_ * auVar133._8_4_;
                                  auVar135._12_4_ = auVar77._12_4_ * auVar133._12_4_;
                                  vminps_avx(auVar135,auVar158);
                                  vpbroadcastd_avx512vl();
                                  vpbroadcastd_avx512vl();
                                  p0.field_0.field_0.x.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar92.field_0;
                                  p0.field_0.field_0.y.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar93.field_0;
                                  p0.field_0._32_16_ = auVar96;
                                  vpcmpeqd_avx2(ZEXT1632((undefined1  [16])vVar92.field_0),
                                                ZEXT1632((undefined1  [16])vVar92.field_0));
                                  auVar77 = vmulps_avx512vl(auVar77,auVar142);
                                  bVar66 = (bool)(bVar55 >> 1 & 1);
                                  bVar7 = (bool)(bVar55 >> 2 & 1);
                                  *(uint *)(ray + 0x80) =
                                       (uint)(bVar55 & 1) * auVar77._0_4_ |
                                       (uint)!(bool)(bVar55 & 1) * (int)fVar100;
                                  *(uint *)(ray + 0x84) =
                                       (uint)bVar66 * auVar77._4_4_ | (uint)!bVar66 * (int)fVar101;
                                  *(uint *)(ray + 0x88) =
                                       (uint)bVar7 * auVar77._8_4_ | (uint)!bVar7 * (int)fVar102;
                                  *(uint *)(ray + 0x8c) =
                                       (uint)(bVar55 >> 3) * auVar77._12_4_ |
                                       (uint)!(bool)(bVar55 >> 3) * (int)fVar103;
                                  itime.field_0 =
                                       (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpmovm2d_avx512vl((ulong)bVar55);
                                  p1.field_0._0_4_ = SUB84(&itime,0);
                                  p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                                  p1.field_0._8_4_ = SUB84(pGVar4->userPtr,0);
                                  p1.field_0._12_4_ = (undefined4)((ulong)pGVar4->userPtr >> 0x20);
                                  p1.field_0._16_4_ = SUB84(context->user,0);
                                  p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                  p1.field_0._32_4_ = SUB84(&p0,0);
                                  p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                                  p1.field_0._40_4_ = 4;
                                  p1.field_0._0_8_ = &itime;
                                  p1.field_0._32_8_ = &p0;
                                  p1.field_0._24_8_ = ray;
                                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                  }
                                  uVar67 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                             (undefined1  [16])itime.field_0);
                                  uVar67 = uVar67 & 0xf;
                                  if ((char)uVar67 != '\0') {
                                    p_Var6 = context->args->filter;
                                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                    }
                                    uVar67 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                               (undefined1  [16])itime.field_0);
                                    uVar67 = uVar67 & 0xf;
                                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    bVar66 = (bool)((byte)uVar67 & 1);
                                    bVar7 = (bool)((byte)(uVar67 >> 1) & 1);
                                    bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                                    bVar9 = SUB81(uVar67 >> 3,0);
                                    *(uint *)(p1.field_0._24_8_ + 0x80) =
                                         (uint)bVar66 * auVar77._0_4_ |
                                         (uint)!bVar66 * *(int *)(p1.field_0._24_8_ + 0x80);
                                    *(uint *)(p1.field_0._24_8_ + 0x84) =
                                         (uint)bVar7 * auVar77._4_4_ |
                                         (uint)!bVar7 * *(int *)(p1.field_0._24_8_ + 0x84);
                                    *(uint *)(p1.field_0._24_8_ + 0x88) =
                                         (uint)bVar8 * auVar77._8_4_ |
                                         (uint)!bVar8 * *(int *)(p1.field_0._24_8_ + 0x88);
                                    *(uint *)(p1.field_0._24_8_ + 0x8c) =
                                         (uint)bVar9 * auVar77._12_4_ |
                                         (uint)!bVar9 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                  }
                                  bVar66 = (bool)((byte)uVar67 & 1);
                                  bVar7 = (bool)((byte)(uVar67 >> 1) & 1);
                                  bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                                  bVar9 = SUB81(uVar67 >> 3,0);
                                  *(uint *)pRVar1 =
                                       (uint)bVar66 * *(int *)pRVar1 | (uint)!bVar66 * (int)fVar100;
                                  *(uint *)(ray + 0x84) =
                                       (uint)bVar7 * *(int *)(ray + 0x84) |
                                       (uint)!bVar7 * (int)fVar101;
                                  *(uint *)(ray + 0x88) =
                                       (uint)bVar8 * *(int *)(ray + 0x88) |
                                       (uint)!bVar8 * (int)fVar102;
                                  *(uint *)(ray + 0x8c) =
                                       (uint)bVar9 * *(int *)(ray + 0x8c) |
                                       (uint)!bVar9 * (int)fVar103;
                                }
                                uVar53 = (ulong)(((byte)uVar67 ^ 0xf) & bVar61);
                                auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              }
                              auVar179 = ZEXT1664(auVar94);
                              auVar178 = ZEXT1664(auVar69);
                              auVar177 = ZEXT1664(auVar83);
                              auVar176 = ZEXT1664(auVar82);
                              auVar175 = ZEXT1664(auVar81);
                              auVar174 = ZEXT1664(auVar77);
                            }
                          }
                          auVar69 = auVar178._0_16_;
                          bVar61 = (byte)uVar53;
                          if (bVar61 == 0) {
                            bVar66 = false;
                          }
                          else {
                            auVar77 = vsubps_avx512vl(auVar71,auVar74);
                            auVar81 = vsubps_avx512vl(auVar72,auVar84);
                            auVar82 = vsubps_avx512vl(auVar70,auVar85);
                            auVar83 = vsubps_avx512vl(auVar73,auVar71);
                            auVar94 = vsubps_avx512vl(auVar75,auVar72);
                            auVar76 = vsubps_avx512vl(auVar76,auVar70);
                            auVar74 = vmulps_avx512vl(auVar81,auVar76);
                            vVar92.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmsub231ps_fma(auVar74,auVar94,auVar82);
                            auVar106._0_4_ = auVar82._0_4_ * auVar83._0_4_;
                            auVar106._4_4_ = auVar82._4_4_ * auVar83._4_4_;
                            auVar106._8_4_ = auVar82._8_4_ * auVar83._8_4_;
                            auVar106._12_4_ = auVar82._12_4_ * auVar83._12_4_;
                            vVar93.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vfmsub231ps_avx512vl(auVar106,auVar76,auVar77);
                            auVar112._0_4_ = auVar94._0_4_ * auVar77._0_4_;
                            auVar112._4_4_ = auVar94._4_4_ * auVar77._4_4_;
                            auVar112._8_4_ = auVar94._8_4_ * auVar77._8_4_;
                            auVar112._12_4_ = auVar94._12_4_ * auVar77._12_4_;
                            auVar73 = vfmsub231ps_fma(auVar112,auVar83,auVar81);
                            auVar95 = vsubps_avx512vl(auVar71,*(undefined1 (*) [16])ray);
                            auVar96 = vsubps_avx512vl(auVar72,*(undefined1 (*) [16])(ray + 0x10));
                            auVar97 = vsubps_avx512vl(auVar70,*(undefined1 (*) [16])(ray + 0x20));
                            auVar74 = *(undefined1 (*) [16])(ray + 0x40);
                            auVar70 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar71 = *(undefined1 (*) [16])(ray + 0x60);
                            auVar72 = vmulps_avx512vl(auVar70,auVar97);
                            auVar72 = vfmsub231ps_fma(auVar72,auVar96,auVar71);
                            auVar167._0_4_ = auVar71._0_4_ * auVar95._0_4_;
                            auVar167._4_4_ = auVar71._4_4_ * auVar95._4_4_;
                            auVar167._8_4_ = auVar71._8_4_ * auVar95._8_4_;
                            auVar167._12_4_ = auVar71._12_4_ * auVar95._12_4_;
                            auVar75 = vfmsub231ps_fma(auVar167,auVar97,auVar74);
                            auVar173._0_4_ = auVar74._0_4_ * auVar96._0_4_;
                            auVar173._4_4_ = auVar74._4_4_ * auVar96._4_4_;
                            auVar173._8_4_ = auVar74._8_4_ * auVar96._8_4_;
                            auVar173._12_4_ = auVar74._12_4_ * auVar96._12_4_;
                            auVar98 = vfmsub231ps_avx512vl(auVar173,auVar95,auVar70);
                            auVar157._0_4_ = auVar71._0_4_ * auVar73._0_4_;
                            auVar157._4_4_ = auVar71._4_4_ * auVar73._4_4_;
                            auVar157._8_4_ = auVar71._8_4_ * auVar73._8_4_;
                            auVar157._12_4_ = auVar71._12_4_ * auVar73._12_4_;
                            auVar70 = vfmadd231ps_avx512vl
                                                (auVar157,(undefined1  [16])vVar93.field_0,auVar70);
                            auVar74 = vfmadd231ps_fma(auVar70,(undefined1  [16])vVar92.field_0,
                                                      auVar74);
                            auVar70 = vandps_avx512vl(auVar74,auVar179._0_16_);
                            auVar71 = vmulps_avx512vl(auVar76,auVar98);
                            auVar71 = vfmadd231ps_avx512vl(auVar71,auVar75,auVar94);
                            auVar71 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar83);
                            auVar71 = vxorps_avx512vl(auVar70,auVar71);
                            uVar10 = vcmpps_avx512vl(auVar71,auVar69,5);
                            bVar55 = (byte)uVar10 & bVar61;
                            if (bVar55 != 0) {
                              auVar164._0_4_ = auVar82._0_4_ * auVar98._0_4_;
                              auVar164._4_4_ = auVar82._4_4_ * auVar98._4_4_;
                              auVar164._8_4_ = auVar82._8_4_ * auVar98._8_4_;
                              auVar164._12_4_ = auVar82._12_4_ * auVar98._12_4_;
                              auVar75 = vfmadd213ps_fma(auVar81,auVar75,auVar164);
                              auVar72 = vfmadd213ps_fma(auVar77,auVar72,auVar75);
                              auVar134._0_4_ = (float)(auVar70._0_4_ ^ auVar72._0_4_);
                              auVar134._4_4_ = (float)(auVar70._4_4_ ^ auVar72._4_4_);
                              auVar134._8_4_ = (float)(auVar70._8_4_ ^ auVar72._8_4_);
                              auVar134._12_4_ = (float)(auVar70._12_4_ ^ auVar72._12_4_);
                              uVar10 = vcmpps_avx512vl(auVar134,auVar69,5);
                              bVar55 = bVar55 & (byte)uVar10;
                              if (bVar55 != 0) {
                                auVar75 = vandps_avx512vl(auVar74,auVar174._0_16_);
                                auVar72 = vsubps_avx(auVar75,auVar71);
                                uVar10 = vcmpps_avx512vl(auVar72,auVar134,5);
                                bVar55 = bVar55 & (byte)uVar10;
                                if (bVar55 != 0) {
                                  auVar162._0_4_ = auVar97._0_4_ * auVar73._0_4_;
                                  auVar162._4_4_ = auVar97._4_4_ * auVar73._4_4_;
                                  auVar162._8_4_ = auVar97._8_4_ * auVar73._8_4_;
                                  auVar162._12_4_ = auVar97._12_4_ * auVar73._12_4_;
                                  auVar72 = vfmadd213ps_fma(auVar96,(undefined1  [16])vVar93.field_0
                                                            ,auVar162);
                                  auVar72 = vfmadd213ps_fma(auVar95,(undefined1  [16])vVar92.field_0
                                                            ,auVar72);
                                  auVar143._0_4_ = auVar70._0_4_ ^ auVar72._0_4_;
                                  auVar143._4_4_ = auVar70._4_4_ ^ auVar72._4_4_;
                                  auVar143._8_4_ = auVar70._8_4_ ^ auVar72._8_4_;
                                  auVar143._12_4_ = auVar70._12_4_ ^ auVar72._12_4_;
                                  auVar151._0_4_ = auVar75._0_4_ * *(float *)(ray + 0x30);
                                  auVar151._4_4_ = auVar75._4_4_ * *(float *)(ray + 0x34);
                                  auVar151._8_4_ = auVar75._8_4_ * *(float *)(ray + 0x38);
                                  auVar151._12_4_ = auVar75._12_4_ * *(float *)(ray + 0x3c);
                                  auVar48 = *(undefined1 (*) [12])(ray + 0x80);
                                  fVar100 = *(float *)(ray + 0x8c);
                                  auVar163._0_4_ = *(float *)(ray + 0x80) * auVar75._0_4_;
                                  auVar163._4_4_ = *(float *)(ray + 0x84) * auVar75._4_4_;
                                  auVar163._8_4_ = *(float *)(ray + 0x88) * auVar75._8_4_;
                                  auVar163._12_4_ = fVar100 * auVar75._12_4_;
                                  uVar10 = vcmpps_avx512vl(auVar143,auVar163,2);
                                  uVar11 = vcmpps_avx512vl(auVar151,auVar143,1);
                                  bVar55 = bVar55 & (byte)uVar10 & (byte)uVar11;
                                  if (bVar55 != 0) {
                                    uVar10 = vcmpps_avx512vl(auVar74,ZEXT816(0) << 0x20,4);
                                    bVar55 = bVar55 & (byte)uVar10;
                                    if (bVar55 != 0) {
                                      pGVar4 = (context->scene->geometries).items
                                               [*(uint *)(lVar62 + 0x40 + uVar65 * 4)].ptr;
                                      uVar166 = pGVar4->mask;
                                      auVar152._4_4_ = uVar166;
                                      auVar152._0_4_ = uVar166;
                                      auVar152._8_4_ = uVar166;
                                      auVar152._12_4_ = uVar166;
                                      uVar10 = vptestmd_avx512vl(auVar152,*(undefined1 (*) [16])
                                                                           (ray + 0x90));
                                      bVar55 = bVar55 & (byte)uVar10 & 0xf;
                                      uVar67 = (ulong)bVar55;
                                      if (bVar55 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar70 = vrcp14ps_avx512vl(auVar75);
                                          auVar159._8_4_ = 0x3f800000;
                                          auVar159._0_8_ = &DAT_3f8000003f800000;
                                          auVar159._12_4_ = 0x3f800000;
                                          auVar74 = vfnmadd213ps_fma(auVar75,auVar70,auVar159);
                                          auVar72 = vfmadd132ps_fma(auVar74,auVar70,auVar70);
                                          auVar126._0_4_ = auVar72._0_4_ * auVar71._0_4_;
                                          auVar126._4_4_ = auVar72._4_4_ * auVar71._4_4_;
                                          auVar126._8_4_ = auVar72._8_4_ * auVar71._8_4_;
                                          auVar126._12_4_ = auVar72._12_4_ * auVar71._12_4_;
                                          auVar74 = vminps_avx(auVar126,auVar159);
                                          auVar136._0_4_ = auVar72._0_4_ * auVar134._0_4_;
                                          auVar136._4_4_ = auVar72._4_4_ * auVar134._4_4_;
                                          auVar136._8_4_ = auVar72._8_4_ * auVar134._8_4_;
                                          auVar136._12_4_ = auVar72._12_4_ * auVar134._12_4_;
                                          auVar70 = vminps_avx(auVar136,auVar159);
                                          vsubps_avx(auVar159,auVar74);
                                          vsubps_avx(auVar159,auVar70);
                                          vpbroadcastd_avx512vl();
                                          vpbroadcastd_avx512vl();
                                          p0.field_0.field_0.x.field_0 =
                                               (vfloat_impl<4>)(vfloat_impl<4>)vVar92.field_0;
                                          p0.field_0.field_0.y.field_0 =
                                               (vfloat_impl<4>)(vfloat_impl<4>)vVar93.field_0;
                                          p0.field_0._32_16_ = auVar73;
                                          vpcmpeqd_avx2(ZEXT1632((undefined1  [16])vVar92.field_0),
                                                        ZEXT1632((undefined1  [16])vVar92.field_0));
                                          local_3618 = auVar48._0_4_;
                                          iStack_3614 = auVar48._4_4_;
                                          iStack_3610 = auVar48._8_4_;
                                          auVar74 = vmulps_avx512vl(auVar72,auVar143);
                                          bVar66 = (bool)(bVar55 >> 1 & 1);
                                          bVar7 = (bool)(bVar55 >> 2 & 1);
                                          *(uint *)(ray + 0x80) =
                                               (uint)(bVar55 & 1) * auVar74._0_4_ |
                                               (uint)!(bool)(bVar55 & 1) * local_3618;
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar66 * auVar74._4_4_ |
                                               (uint)!bVar66 * iStack_3614;
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar7 * auVar74._8_4_ |
                                               (uint)!bVar7 * iStack_3610;
                                          *(uint *)(ray + 0x8c) =
                                               (uint)(bVar55 >> 3) * auVar74._12_4_ |
                                               (uint)!(bool)(bVar55 >> 3) * (int)fVar100;
                                          itime.field_0 =
                                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                               vpmovm2d_avx512vl(uVar67);
                                          p1.field_0._0_4_ = SUB84(&itime,0);
                                          p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                                          p1.field_0._8_4_ = SUB84(pGVar4->userPtr,0);
                                          p1.field_0._12_4_ =
                                               (undefined4)((ulong)pGVar4->userPtr >> 0x20);
                                          p1.field_0._16_4_ = SUB84(context->user,0);
                                          p1.field_0._20_4_ =
                                               (undefined4)((ulong)context->user >> 0x20);
                                          p1.field_0._32_4_ = SUB84(&p0,0);
                                          p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                                          p1.field_0._40_4_ = 4;
                                          p1.field_0._0_8_ = &itime;
                                          p1.field_0._32_8_ = &p0;
                                          p1.field_0._24_8_ = ray;
                                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                            (*pGVar4->occlusionFilterN)
                                                      ((RTCFilterFunctionNArguments *)&p1);
                                          }
                                          uVar67 = vptestmd_avx512vl((undefined1  [16])itime.field_0
                                                                     ,(undefined1  [16])
                                                                      itime.field_0);
                                          uVar67 = uVar67 & 0xf;
                                          if ((char)uVar67 != '\0') {
                                            p_Var6 = context->args->filter;
                                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                            }
                                            uVar67 = vptestmd_avx512vl((undefined1  [16])
                                                                       itime.field_0,
                                                                       (undefined1  [16])
                                                                       itime.field_0);
                                            uVar67 = uVar67 & 0xf;
                                            auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar66 = (bool)((byte)uVar67 & 1);
                                            bVar7 = (bool)((byte)(uVar67 >> 1) & 1);
                                            bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                                            bVar9 = SUB81(uVar67 >> 3,0);
                                            *(uint *)(p1.field_0._24_8_ + 0x80) =
                                                 (uint)bVar66 * auVar74._0_4_ |
                                                 (uint)!bVar66 * *(int *)(p1.field_0._24_8_ + 0x80);
                                            *(uint *)(p1.field_0._24_8_ + 0x84) =
                                                 (uint)bVar7 * auVar74._4_4_ |
                                                 (uint)!bVar7 * *(int *)(p1.field_0._24_8_ + 0x84);
                                            *(uint *)(p1.field_0._24_8_ + 0x88) =
                                                 (uint)bVar8 * auVar74._8_4_ |
                                                 (uint)!bVar8 * *(int *)(p1.field_0._24_8_ + 0x88);
                                            *(uint *)(p1.field_0._24_8_ + 0x8c) =
                                                 (uint)bVar9 * auVar74._12_4_ |
                                                 (uint)!bVar9 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                          }
                                          bVar66 = (bool)((byte)uVar67 & 1);
                                          auVar99._0_4_ =
                                               (uint)bVar66 * *(int *)pRVar1 |
                                               (uint)!bVar66 * local_3618;
                                          bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                                          auVar99._4_4_ =
                                               (uint)bVar66 * *(int *)(ray + 0x84) |
                                               (uint)!bVar66 * iStack_3614;
                                          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
                                          auVar99._8_4_ =
                                               (uint)bVar66 * *(int *)(ray + 0x88) |
                                               (uint)!bVar66 * iStack_3610;
                                          bVar66 = SUB81(uVar67 >> 3,0);
                                          auVar99._12_4_ =
                                               (uint)bVar66 * *(int *)(ray + 0x8c) |
                                               (uint)!bVar66 * (int)fVar100;
                                          *(undefined1 (*) [16])pRVar1 = auVar99;
                                        }
                                        uVar53 = (ulong)(((byte)uVar67 ^ 0xf) & bVar61);
                                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar174 = ZEXT1664(auVar74);
                                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar175 = ZEXT1664(auVar74);
                                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        auVar176 = ZEXT1664(auVar74);
                                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar177 = ZEXT1664(auVar74);
                                        auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                        auVar178 = ZEXT1664(auVar69);
                                        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar179 = ZEXT1664(auVar69);
                                        goto LAB_0081e77d;
                                      }
                                    }
                                  }
                                }
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar174 = ZEXT1664(auVar74);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar175 = ZEXT1664(auVar74);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar176 = ZEXT1664(auVar74);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar177 = ZEXT1664(auVar74);
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar178 = ZEXT1664(auVar69);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar179 = ZEXT1664(auVar69);
                              }
                            }
LAB_0081e77d:
                            bVar66 = (char)uVar53 != '\0';
                          }
                          bVar61 = (byte)uVar53;
                          if ((!bVar66) || (bVar66 = 2 < uVar65, uVar65 = uVar65 + 1, bVar66))
                          break;
                        }
                        bVar49 = bVar49 & bVar61;
                        uVar52 = (ulong)bVar49;
                      } while ((bVar49 != 0) && (uVar54 = uVar54 + 1, uVar54 < uVar68 - 8));
                      bVar49 = bVar49 ^ 0xf;
                    }
                    bVar49 = (byte)local_37d4 | bVar49;
                    local_37d4 = (uint)bVar49;
                    if (bVar49 == 0xf) goto LAB_0081f2af;
                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    tray.tfar.field_0.i[0] =
                         (uint)(bVar49 & 1) * auVar69._0_4_ |
                         (uint)!(bool)(bVar49 & 1) * tray.tfar.field_0.i[0];
                    bVar66 = (bool)(bVar49 >> 1 & 1);
                    tray.tfar.field_0.i[1] =
                         (uint)bVar66 * auVar69._4_4_ | (uint)!bVar66 * tray.tfar.field_0.i[1];
                    bVar66 = (bool)(bVar49 >> 2 & 1);
                    tray.tfar.field_0.i[2] =
                         (uint)bVar66 * auVar69._8_4_ | (uint)!bVar66 * tray.tfar.field_0.i[2];
                    bVar66 = (bool)(bVar49 >> 3 & 1);
                    tray.tfar.field_0.i[3] =
                         (uint)bVar66 * auVar69._12_4_ | (uint)!bVar66 * tray.tfar.field_0.i[3];
                    iVar51 = 0;
                    break;
                  }
                  goto LAB_0081f2e4;
                }
                uVar10 = vcmpps_avx512vl(auVar168._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                uVar52 = root.ptr & 0xfffffffffffffff0;
                auVar168 = ZEXT1664(auVar177._0_16_);
                uVar68 = 0;
                root.ptr = 8;
                do {
                  sVar3 = *(size_t *)(uVar52 + uVar68 * 8);
                  if (sVar3 != 8) {
                    uVar64 = *(undefined4 *)(uVar52 + 0x100 + uVar68 * 4);
                    auVar111._4_4_ = uVar64;
                    auVar111._0_4_ = uVar64;
                    auVar111._8_4_ = uVar64;
                    auVar111._12_4_ = uVar64;
                    auVar69 = *(undefined1 (*) [16])(ray + 0x70);
                    uVar64 = *(undefined4 *)(uVar52 + 0x40 + uVar68 * 4);
                    auVar16._4_4_ = uVar64;
                    auVar16._0_4_ = uVar64;
                    auVar16._8_4_ = uVar64;
                    auVar16._12_4_ = uVar64;
                    auVar74 = vfmadd213ps_avx512vl(auVar111,auVar69,auVar16);
                    uVar64 = *(undefined4 *)(uVar52 + 0x140 + uVar68 * 4);
                    auVar117._4_4_ = uVar64;
                    auVar117._0_4_ = uVar64;
                    auVar117._8_4_ = uVar64;
                    auVar117._12_4_ = uVar64;
                    uVar64 = *(undefined4 *)(uVar52 + 0x80 + uVar68 * 4);
                    auVar17._4_4_ = uVar64;
                    auVar17._0_4_ = uVar64;
                    auVar17._8_4_ = uVar64;
                    auVar17._12_4_ = uVar64;
                    auVar70 = vfmadd213ps_avx512vl(auVar117,auVar69,auVar17);
                    uVar64 = *(undefined4 *)(uVar52 + 0x180 + uVar68 * 4);
                    auVar124._4_4_ = uVar64;
                    auVar124._0_4_ = uVar64;
                    auVar124._8_4_ = uVar64;
                    auVar124._12_4_ = uVar64;
                    uVar64 = *(undefined4 *)(uVar52 + 0xc0 + uVar68 * 4);
                    auVar18._4_4_ = uVar64;
                    auVar18._0_4_ = uVar64;
                    auVar18._8_4_ = uVar64;
                    auVar18._12_4_ = uVar64;
                    auVar73 = vfmadd213ps_avx512vl(auVar124,auVar69,auVar18);
                    uVar64 = *(undefined4 *)(uVar52 + 0x120 + uVar68 * 4);
                    auVar131._4_4_ = uVar64;
                    auVar131._0_4_ = uVar64;
                    auVar131._8_4_ = uVar64;
                    auVar131._12_4_ = uVar64;
                    uVar64 = *(undefined4 *)(uVar52 + 0x60 + uVar68 * 4);
                    auVar19._4_4_ = uVar64;
                    auVar19._0_4_ = uVar64;
                    auVar19._8_4_ = uVar64;
                    auVar19._12_4_ = uVar64;
                    auVar75 = vfmadd213ps_avx512vl(auVar131,auVar69,auVar19);
                    uVar64 = *(undefined4 *)(uVar52 + 0x160 + uVar68 * 4);
                    auVar141._4_4_ = uVar64;
                    auVar141._0_4_ = uVar64;
                    auVar141._8_4_ = uVar64;
                    auVar141._12_4_ = uVar64;
                    uVar64 = *(undefined4 *)(uVar52 + 0xa0 + uVar68 * 4);
                    auVar20._4_4_ = uVar64;
                    auVar20._0_4_ = uVar64;
                    auVar20._8_4_ = uVar64;
                    auVar20._12_4_ = uVar64;
                    auVar76 = vfmadd213ps_avx512vl(auVar141,auVar69,auVar20);
                    uVar64 = *(undefined4 *)(uVar52 + 0x1a0 + uVar68 * 4);
                    auVar148._4_4_ = uVar64;
                    auVar148._0_4_ = uVar64;
                    auVar148._8_4_ = uVar64;
                    auVar148._12_4_ = uVar64;
                    uVar64 = *(undefined4 *)(uVar52 + 0xe0 + uVar68 * 4);
                    auVar21._4_4_ = uVar64;
                    auVar21._0_4_ = uVar64;
                    auVar21._8_4_ = uVar64;
                    auVar21._12_4_ = uVar64;
                    auVar77 = vfmadd213ps_avx512vl(auVar148,auVar69,auVar21);
                    auVar46._4_4_ = tray.org_rdir.field_0._4_4_;
                    auVar46._0_4_ = tray.org_rdir.field_0._0_4_;
                    auVar46._8_4_ = tray.org_rdir.field_0._8_4_;
                    auVar46._12_4_ = tray.org_rdir.field_0._12_4_;
                    auVar47._4_4_ = tray.org_rdir.field_0._20_4_;
                    auVar47._0_4_ = tray.org_rdir.field_0._16_4_;
                    auVar47._8_4_ = tray.org_rdir.field_0._24_4_;
                    auVar47._12_4_ = tray.org_rdir.field_0._28_4_;
                    auVar71 = vfmsub213ps_fma(auVar74,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.x.field_0,auVar46);
                    auVar72 = vfmsub213ps_fma(auVar70,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.y.field_0,auVar47);
                    auVar73 = vfmsub213ps_fma(auVar73,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0,
                                              (undefined1  [16])
                                              tray.org_rdir.field_0.field_0.z.field_0);
                    auVar75 = vfmsub213ps_fma(auVar75,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.x.field_0,auVar46);
                    auVar76 = vfmsub213ps_fma(auVar76,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.y.field_0,auVar47);
                    auVar77 = vfmsub213ps_fma(auVar77,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0,
                                              (undefined1  [16])
                                              tray.org_rdir.field_0.field_0.z.field_0);
                    auVar74 = vpminsd_avx(auVar71,auVar75);
                    auVar70 = vpminsd_avx(auVar72,auVar76);
                    auVar74 = vpmaxsd_avx(auVar74,auVar70);
                    auVar70 = vpminsd_avx(auVar73,auVar77);
                    auVar74 = vpmaxsd_avx(auVar74,auVar70);
                    auVar70 = vpmaxsd_avx(auVar71,auVar75);
                    auVar71 = vpmaxsd_avx(auVar72,auVar76);
                    auVar71 = vpminsd_avx(auVar70,auVar71);
                    auVar70 = vpmaxsd_avx(auVar73,auVar77);
                    auVar71 = vpminsd_avx(auVar71,auVar70);
                    auVar70 = vpmaxsd_avx(auVar74,(undefined1  [16])tray.tnear.field_0);
                    auVar71 = vpminsd_avx(auVar71,(undefined1  [16])tray.tfar.field_0);
                    uVar11 = vcmpps_avx512vl(auVar70,auVar71,2);
                    bVar49 = (byte)uVar11;
                    if ((uVar166 & 7) == 6) {
                      uVar64 = *(undefined4 *)(uVar52 + 0x1e0 + uVar68 * 4);
                      auVar22._4_4_ = uVar64;
                      auVar22._0_4_ = uVar64;
                      auVar22._8_4_ = uVar64;
                      auVar22._12_4_ = uVar64;
                      uVar11 = vcmpps_avx512vl(auVar69,auVar22,1);
                      uVar64 = *(undefined4 *)(uVar52 + 0x1c0 + uVar68 * 4);
                      auVar23._4_4_ = uVar64;
                      auVar23._0_4_ = uVar64;
                      auVar23._8_4_ = uVar64;
                      auVar23._12_4_ = uVar64;
                      uVar12 = vcmpps_avx512vl(auVar69,auVar23,0xd);
                      bVar49 = (byte)uVar11 & (byte)uVar12 & bVar49;
                    }
                    bVar49 = bVar49 & (byte)uVar10;
                    if (bVar49 != 0) {
                      auVar74 = vblendmps_avx512vl(auVar177._0_16_,auVar74);
                      bVar66 = (bool)(bVar49 >> 1 & 1);
                      bVar7 = (bool)(bVar49 >> 2 & 1);
                      bVar8 = (bool)(bVar49 >> 3 & 1);
                      if (root.ptr != 8) {
                        pNVar63->ptr = root.ptr;
                        pNVar63 = pNVar63 + 1;
                        *paVar56 = auVar168._0_16_;
                        paVar56 = paVar56 + 1;
                      }
                      auVar168 = ZEXT1664(CONCAT412((uint)bVar8 * auVar74._12_4_ |
                                                    (uint)!bVar8 * auVar69._12_4_,
                                                    CONCAT48((uint)bVar7 * auVar74._8_4_ |
                                                             (uint)!bVar7 * auVar69._8_4_,
                                                             CONCAT44((uint)bVar66 * auVar74._4_4_ |
                                                                      (uint)!bVar66 * auVar69._4_4_,
                                                                      (uint)(bVar49 & 1) *
                                                                      auVar74._0_4_ |
                                                                      (uint)!(bool)(bVar49 & 1) *
                                                                      auVar69._0_4_))));
                      root.ptr = sVar3;
                    }
                  }
                } while ((sVar3 != 8) && (bVar66 = uVar68 < 7, uVar68 = uVar68 + 1, bVar66));
                iVar51 = 0;
                if (root.ptr == 8) {
LAB_0081e3bc:
                  bVar66 = false;
                  iVar51 = 4;
                }
                else {
                  uVar10 = vcmpps_avx512vl((undefined1  [16])auVar168._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar66 = true;
                  if ((uint)POPCOUNT((int)uVar10) <= uVar59) {
                    pNVar63->ptr = root.ptr;
                    pNVar63 = pNVar63 + 1;
                    *paVar56 = auVar168._0_16_;
                    paVar56 = paVar56 + 1;
                    goto LAB_0081e3bc;
                  }
                }
              } while (bVar66);
            }
          }
        }
      } while (iVar51 != 3);
      bVar50 = (byte)local_37d4 & bVar50;
      bVar66 = (bool)(bVar50 >> 1 & 1);
      bVar7 = (bool)(bVar50 >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)(bVar50 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar50 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar66 * auVar176._4_4_ | (uint)!bVar66 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar50 >> 3) * auVar176._12_4_ | (uint)!(bool)(bVar50 >> 3) * *(int *)(ray + 0x8c)
      ;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }